

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

optional<unsigned_int> __thiscall wasm::WATParser::Lexer::takeU<unsigned_int>(Lexer *this)

{
  _Optional_payload_base<unsigned_int> _Var1;
  string_view in;
  undefined1 local_40 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> result;
  
  in = next(this);
  anon_unknown_0::integer
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40,in);
  if ((result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
       ._M_payload.
       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>._M_payload
       ._M_value.sign._0_1_ == '\x01') &&
     ((ulong)result.
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
             _M_payload.
             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
             _M_payload._M_value.super_LexResult.span._M_str >> 0x20 == 0 &&
      result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_payload._M_value.n._0_4_ == 0)) {
    this->pos = this->pos + (long)local_40;
    advance(this);
    _Var1 = (_Optional_payload_base<unsigned_int>)
            ((ulong)result.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                    ._M_payload._M_value.super_LexResult.span._M_str | 0x100000000);
  }
  else {
    _Var1._M_payload = (_Storage<unsigned_int,_true>)0x0;
    _Var1._M_engaged = false;
    _Var1._5_3_ = 0;
  }
  return (optional<unsigned_int>)_Var1;
}

Assistant:

std::optional<T> Lexer::takeU() {
  static_assert(std::is_integral_v<T> && std::is_unsigned_v<T>);
  if (auto result = integer(next()); result && result->isUnsigned<T>()) {
    pos += result->span.size();
    advance();
    return T(result->n);
  }
  // TODO: Add error production for unsigned overflow.
  return std::nullopt;
}